

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::SendMessage::encode(SendMessage *this,uint8_t *buffer)

{
  uint8_t *buffer_local;
  SendMessage *this_local;
  
  if ((this->argumentCount == 0) && (this->selectorIndex < 0x10)) {
    this_local = (SendMessage *)(buffer + 1);
    *buffer = (char)this->selectorIndex + 0x80;
  }
  else if ((this->argumentCount == 1) && (this->selectorIndex < 0x10)) {
    this_local = (SendMessage *)(buffer + 1);
    *buffer = (char)this->selectorIndex + 0x90;
  }
  else if ((this->argumentCount == 2) && (this->selectorIndex < 0x10)) {
    this_local = (SendMessage *)(buffer + 1);
    *buffer = (char)this->selectorIndex + 0xa0;
  }
  else {
    if (7 < this->argumentCount) {
      fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
              "virtual uint8_t *Lodtalk::MethodAssembler::SendMessage::encode(uint8_t *)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
              ,0x20a);
      abort();
    }
    if (0x1f < this->selectorIndex) {
      fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
              "virtual uint8_t *Lodtalk::MethodAssembler::SendMessage::encode(uint8_t *)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
              ,0x20d);
      abort();
    }
    *buffer = 0xea;
    this_local = (SendMessage *)(buffer + 2);
    buffer[1] = (byte)this->argumentCount & 7 | (byte)((this->selectorIndex & 0x1fU) << 3);
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs0First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs1First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs2First + selectorIndex);
			return buffer;
		}

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();

		*buffer++ = BytecodeSet::Send;
		*buffer++ = (argumentCount & BytecodeSet::Send_ArgumentCountMask) |
			((selectorIndex & BytecodeSet::Send_LiteralIndexMask) << BytecodeSet::Send_LiteralIndexShift);
		return buffer;
	}